

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::swap(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
       *this,raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
             *that)

{
  size_t *__a;
  size_t *__b;
  hasher *__a_00;
  hasher *__b_00;
  key_equal *__a_01;
  key_equal *__b_01;
  allocator_type *paVar1;
  allocator_type *paVar2;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *that_local;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *this_local;
  
  std::swap<signed_char*>(&this->ctrl_,&that->ctrl_);
  std::swap<int*>(&this->slots_,&that->slots_);
  std::swap<unsigned_long>(&this->size_,&that->size_);
  std::swap<unsigned_long>(&this->capacity_,&that->capacity_);
  __a = growth_left(this);
  __b = growth_left(that);
  std::swap<unsigned_long>(__a,__b);
  __a_00 = hash_ref(this);
  __b_00 = hash_ref(that);
  std::swap<phmap::priv::StatefulTestingHash>(__a_00,__b_00);
  __a_01 = eq_ref(this);
  __b_01 = eq_ref(that);
  std::swap<phmap::priv::StatefulTestingEqual>(__a_01,__b_01);
  priv::swap((HashtablezInfoHandle *)&this->field_0x20,(HashtablezInfoHandle *)&that->field_0x20);
  paVar1 = alloc_ref(this);
  paVar2 = alloc_ref(that);
  SwapAlloc<phmap::priv::Alloc<int>>(paVar1,paVar2);
  return;
}

Assistant:

void swap(raw_hash_set& that) noexcept(
        IsNoThrowSwappable<hasher>() && IsNoThrowSwappable<key_equal>() &&
        (!AllocTraits::propagate_on_container_swap::value ||
         IsNoThrowSwappable<allocator_type>(typename AllocTraits::propagate_on_container_swap{}))) {
        using std::swap;
        swap(ctrl_, that.ctrl_);
        swap(slots_, that.slots_);
        swap(size_, that.size_);
        swap(capacity_, that.capacity_);
        swap(growth_left(), that.growth_left());
        swap(hash_ref(), that.hash_ref());
        swap(eq_ref(), that.eq_ref());
        swap(infoz_, that.infoz_);
        SwapAlloc(alloc_ref(), that.alloc_ref(), typename AllocTraits::propagate_on_container_swap{});
    }